

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O1

void baoliSearch(int curlv,int remainF,int remainA,int gridSz)

{
  double dVar1;
  float fVar2;
  long lVar3;
  pointer pGVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  pointer ppiVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int tAssignN [4];
  int local_b8 [6];
  BelongStructure *local_a0;
  long local_98;
  long local_90;
  pointer local_88;
  long local_80;
  int local_78 [18];
  
  if (curlv == gridSz || remainA == 0 && remainF == 0) {
    lVar3 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar3 - (long)logtime.__d.__r) / 1000;
    if (0x37e11d9e7 < lVar3 - (long)logtime.__d.__r) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR:TLE");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0);
    }
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    if (0 < gridSz) {
      lVar3 = 0;
      pGVar4 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (*(int *)((long)sign + lVar3) == 2) {
          local_b8[pGVar4->carrierPos] = local_b8[pGVar4->carrierPos] + 1;
        }
        pGVar4 = pGVar4 + 1;
        lVar3 = lVar3 + 4;
      } while ((ulong)(uint)gridSz << 2 != lVar3);
    }
    lVar3 = (long)local_b8[0];
    lVar7 = (long)local_b8[1];
    lVar8 = (long)local_b8[2];
    lVar11 = (long)local_b8[3];
    ppiVar12 = dpRes[lVar3][lVar7][lVar8][lVar11].belongings.
               super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_88 = *(pointer *)
                ((long)&dpRes[lVar3][lVar7][lVar8][lVar11].belongings.
                        super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data + 8);
    if (ppiVar12 != local_88) {
      local_a0 = dpRes[lVar3][lVar7][lVar8] + lVar11;
      uVar19 = (ulong)(uint)gridSz;
      local_90 = (long)gridSz;
      local_80 = 0;
      local_98 = uVar19 * 4;
      do {
        piVar16 = *ppiVar12;
        lVar3 = 0;
        do {
          *(undefined4 *)((long)curAssign + lVar3) = *(undefined4 *)((long)piVar16 + lVar3);
          fVar2 = op_coef;
          lVar3 = lVar3 + 4;
        } while (lVar3 != 0x40);
        fVar21 = *(float *)((long)(local_a0->as).super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + local_80 * 4);
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        local_78[0xe] = 0;
        local_78[0xf] = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        if (gridSz < 1) {
          fVar22 = 0.0;
        }
        else {
          fVar22 = 0.0;
          uVar15 = 0;
          iVar14 = 0;
          do {
            if (sign[uVar15] == 1) {
              lVar3 = (long)iVar14;
              iVar14 = iVar14 + 1;
              fVar20 = formulaDamageOP(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar15].gridSizeFsb,
                                       planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar3);
              fVar22 = fVar22 + fVar20;
            }
            else if ((sign[uVar15] == 2) && (0 < (long)curBomberNum)) {
              piVar13 = curAssign;
              piVar18 = curAssignGrid;
              lVar3 = 0;
              piVar16 = local_78;
              do {
                if ((gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15].carrierPos == *piVar13) &&
                   (*piVar16 == 0)) {
                  fVar20 = formulaDamageOP(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar15].
                                           gridSizeFsb,
                                           (Plane *)((long)planeVecA.
                                                                                                                      
                                                  super__Vector_base<Plane,_std::allocator<Plane>_>.
                                                  _M_impl.super__Vector_impl_data._M_start - lVar3))
                  ;
                  fVar22 = fVar22 + fVar20;
                  *piVar16 = 1;
                  *piVar18 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar15].gridPos;
                  break;
                }
                piVar16 = piVar16 + 1;
                lVar3 = lVar3 + -0x38;
                piVar18 = piVar18 + 1;
                piVar13 = piVar13 + 1;
              } while ((long)curBomberNum * 0x38 + lVar3 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar19);
        }
        fVar21 = fVar2 * fVar22 + fVar21;
        if (resAtk < fVar21) {
          iVar14 = 0;
          iVar10 = 0;
          if ((0 < gridSz) && (0 < curFighterNum)) {
            iVar17 = 0;
            lVar3 = 2;
            uVar15 = 1;
            piVar16 = sign;
            iVar10 = 0;
            do {
              if (*piVar16 == 1) {
                iVar6 = planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar17].airSupremacy;
                iVar9 = 3;
                if (planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar17].category == 3) {
                  iVar9 = 0x19;
                }
                dVar1 = (double)(&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                                   super__Vector_impl_data._M_start)->carrierPos)[lVar3];
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                iVar10 = iVar9 + iVar10 + (int)((double)iVar6 * dVar1);
                iVar17 = iVar17 + 1;
              }
              if (uVar19 <= uVar15) break;
              lVar3 = lVar3 + 6;
              uVar15 = uVar15 + 1;
              piVar16 = piVar16 + 1;
            } while (iVar17 < curFighterNum);
          }
          if (0 < curBomberNum) {
            lVar3 = 0;
            lVar7 = 9;
            lVar8 = 0;
            iVar14 = 0;
            do {
              iVar6 = iVar14 + 3;
              iVar17 = *(int *)((long)&((planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->name).
                                       _M_dataplus._M_p + lVar7 * 4);
              iVar14 = iVar14 + 0x19;
              if (*(int *)((long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar7 * 4 + -4) != 3) {
                iVar14 = iVar6;
              }
              if (iVar17 != 0) {
                dVar1 = (double)theCarrier.super__Vector_base<Carrier,_std::allocator<Carrier>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [*(int *)((long)curAssign + lVar3)].gridSize
                                [*(int *)((long)curAssignGrid + lVar3)];
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                iVar14 = iVar14 + (int)((double)iVar17 * dVar1);
              }
              lVar8 = lVar8 + 1;
              lVar3 = lVar3 + 4;
              lVar7 = lVar7 + 0xe;
            } while (lVar8 < curBomberNum);
          }
          iVar14 = iVar14 + iVar10;
          if (tarAirSupremacy <= iVar14) {
            resBomberNum = curBomberNum - remainA;
            resAtk = fVar21;
            resAS = iVar14;
            if (0 < gridSz) {
              lVar3 = 0;
              do {
                *(int *)((long)resSign + lVar3) = *(int *)((long)sign + lVar3) + 0x30;
                lVar3 = lVar3 + 4;
              } while (local_98 != lVar3);
            }
            resSign[local_90] = 0;
            resAssign[0] = curAssign[0];
            resAssign[1] = curAssign[1];
            resAssign[2] = curAssign[2];
            resAssign[3] = curAssign[3];
            resAssign[4] = curAssign[4];
            resAssign[5] = curAssign[5];
            resAssign[6] = curAssign[6];
            resAssign[7] = curAssign[7];
            resAssign[8] = curAssign[8];
            resAssign[9] = curAssign[9];
            resAssign[10] = curAssign[10];
            resAssign[0xb] = curAssign[0xb];
            resAssign[0xc] = curAssign[0xc];
            resAssign[0xd] = curAssign[0xd];
            resAssign[0xe] = curAssign[0xe];
            resAssign[0xf] = curAssign[0xf];
            resAssignGrid[0xc] = curAssignGrid[0xc];
            resAssignGrid[0xd] = curAssignGrid[0xd];
            resAssignGrid[0xe] = curAssignGrid[0xe];
            resAssignGrid[0xf] = curAssignGrid[0xf];
            resAssignGrid[8] = curAssignGrid[8];
            resAssignGrid[9] = curAssignGrid[9];
            resAssignGrid[10] = curAssignGrid[10];
            resAssignGrid[0xb] = curAssignGrid[0xb];
            resAssignGrid[4] = curAssignGrid[4];
            resAssignGrid[5] = curAssignGrid[5];
            resAssignGrid[6] = curAssignGrid[6];
            resAssignGrid[7] = curAssignGrid[7];
            resAssignGrid[0] = curAssignGrid[0];
            resAssignGrid[1] = curAssignGrid[1];
            resAssignGrid[2] = curAssignGrid[2];
            resAssignGrid[3] = curAssignGrid[3];
            if (flushFlag == true) {
              std::vector<Plane,_std::allocator<Plane>_>::operator=(&ResPlaneVecA,&planeVecA);
              flushFlag = false;
            }
          }
        }
        local_80 = local_80 + 1;
        ppiVar12 = ppiVar12 + 1;
      } while (ppiVar12 != local_88);
    }
  }
  else {
    if (remainF != 0) {
      sign[curlv] = 1;
      baoliSearch(curlv + 1,remainF + -1,remainA,gridSz);
      sign[curlv] = 0;
    }
    if (remainA != 0) {
      sign[curlv] = 2;
      iVar14 = 0x32;
      if ((0 < gridSz) && (0 < curFighterNum)) {
        iVar10 = 0;
        piVar16 = sign;
        lVar3 = 2;
        uVar19 = 1;
        iVar14 = 0;
        do {
          if ((uint)*piVar16 < 2) {
            iVar17 = planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10].airSupremacy;
            iVar6 = 3;
            if (planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10].category == 3) {
              iVar6 = 0x19;
            }
            dVar1 = (double)(&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                               super__Vector_impl_data._M_start)->carrierPos)[lVar3];
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
            iVar14 = iVar6 + iVar14 + (int)((double)iVar17 * dVar1);
            iVar10 = iVar10 + 1;
          }
          if ((uint)gridSz <= uVar19) break;
          lVar3 = lVar3 + 6;
          uVar19 = uVar19 + 1;
          piVar16 = (int *)((uint *)piVar16 + 1);
        } while (iVar10 < curFighterNum);
        iVar14 = iVar14 + 0x32;
      }
      if (tarAirSupremacy <= curBomberNum * 3 + iVar14) {
        if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_start[curlv].isFighterOnly == 0) {
          remainA = remainA + -1;
        }
        else {
          sign[curlv] = 0;
        }
        baoliSearch(curlv + 1,remainF,remainA,gridSz);
      }
      sign[curlv] = 0;
    }
  }
  return;
}

Assistant:

void baoliSearch(int curlv,int remainF,int remainA,int gridSz){
    if(curlv == gridSz || (remainF == 0 && remainA == 0)){//�ݹ�����
        if(restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now()-logtime),restime.count()>TLE*1000000){
            cout<<"ERROR:TLE"<<endl;
            exit(0);
        }
        int tAssignN[4] = {0, 0, 0, 0};
        getAssignN(tAssignN, gridSz);//sav avail grids num to ships
        BelongStructure &curres=dpRes[tAssignN[0]][tAssignN[1]][tAssignN[2]][tAssignN[3]];
        vector<int *> &tlist=curres.belongings;
        int i=0;
        for(vector<int *>::iterator iter=tlist.begin(),end=tlist.end();iter!=end;++iter){
            getCurAssign(iter);
            float newAtk = curres.as[i++] + op_coef * calOPAtk(gridSz);
            if(newAtk > resAtk){
                int newAS = calAS(gridSz) + calASofBomber(gridSz);
                if(newAS >= tarAirSupremacy){
                    //write cur data to res
                    resAtk = newAtk;
                    resAS = newAS;
                    resBomberNum = curBomberNum - remainA;
                    copySign2Res(resSign, gridSz);
                    copyCurAssign2Res(resAssign,resAssignGrid);

                    if(flushFlag){
                        ResPlaneVecA = planeVecA;
                        flushFlag = 0;
                    }
                }
            }
        }
        return;
    }
    if(remainF){//���Է���ս���������ⷣվ
        sign[curlv]=1;
        baoliSearch(curlv+1,remainF-1,remainA,gridSz);
        sign[curlv]=0;
    }
    if(remainA){//���Է��ù�����
        sign[curlv]=2;
        if(cutF(curlv+1,remainF,gridSz)){
            if(gridVec[curlv].isFighterOnly){
                sign[curlv]=0;
                baoliSearch(curlv+1,remainF,remainA,gridSz);
            }
            else{
                baoliSearch(curlv+1,remainF,remainA-1,gridSz);
            }
        }
        sign[curlv]=0;
    }
}